

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

qint64 __thiscall QFSFileEnginePrivate::nativeRead(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  QAbstractFileEngine *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  qint64 qVar7;
  long in_FS_OFFSET;
  qint64 qStack_80;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fh != (FILE *)0x0) {
    this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
    bVar1 = isSequentialFdFh(this);
    if (bVar1) {
      iVar2 = fileno((FILE *)this->fh);
      uVar3 = fcntl(iVar2,3);
      qStack_80 = 0;
      for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
        if ((uVar3 >> 0xb & 1) == 0) {
          iVar4 = fileno((FILE *)this->fh);
          fcntl(iVar4,4,(ulong)(uVar3 | 0x800));
        }
        do {
          sVar5 = fread(data + qStack_80,1,len - qStack_80,(FILE *)this->fh);
          if (sVar5 != 0) {
            qStack_80 = qStack_80 + sVar5;
            goto LAB_0012c679;
          }
          iVar4 = feof((FILE *)this->fh);
        } while ((iVar4 == 0) && (piVar6 = __errno_location(), *piVar6 == 4));
        if (qStack_80 == 0 && (uVar3 >> 0xb & 1) == 0) {
          iVar4 = fileno((FILE *)this->fh);
          fcntl(iVar4,4,(ulong)uVar3);
          while (iVar4 = fgetc((FILE *)this->fh), iVar4 == -1) {
            piVar6 = __errno_location();
            if (*piVar6 != 4) {
              qStack_80 = 0;
              goto LAB_0012c679;
            }
          }
          *data = (char)iVar4;
          qStack_80 = 1;
        }
        else {
          if (qStack_80 != 0) break;
          qStack_80 = 0;
        }
      }
LAB_0012c679:
      if ((uVar3 >> 0xb & 1) == 0) {
        iVar2 = fileno((FILE *)this->fh);
        fcntl(iVar2,4,(ulong)uVar3);
      }
      if (qStack_80 == 0) {
        iVar2 = feof((FILE *)this->fh);
        if (iVar2 == 0) {
          piVar6 = __errno_location();
          qt_error_string((QString *)&local_50,*piVar6);
          QAbstractFileEngine::setError(this_00,ReadError,(QString *)&local_50);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          qStack_80 = -1;
        }
        else {
          qStack_80 = 0;
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return qStack_80;
      }
      goto LAB_0012c707;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qVar7 = readFdFh(this,data,len);
    return qVar7;
  }
LAB_0012c707:
  __stack_chk_fail();
}

Assistant:

qint64 QFSFileEnginePrivate::nativeRead(char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (fh && nativeIsSequential()) {
        size_t readBytes = 0;
        int oldFlags = fcntl(QT_FILENO(fh), F_GETFL);
        for (int i = 0; i < 2; ++i) {
            // Unix: Make the underlying file descriptor non-blocking
            if ((oldFlags & O_NONBLOCK) == 0)
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags | O_NONBLOCK);

            // Cross platform stdlib read
            size_t read = 0;
            do {
                read = fread(data + readBytes, 1, size_t(len - readBytes), fh);
            } while (read == 0 && !feof(fh) && errno == EINTR);
            if (read > 0) {
                readBytes += read;
                break;
            } else {
                if (readBytes)
                    break;
                readBytes = read;
            }

            // Unix: Restore the blocking state of the underlying socket
            if ((oldFlags & O_NONBLOCK) == 0) {
                fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
                if (readBytes == 0) {
                    int readByte = 0;
                    do {
                        readByte = fgetc(fh);
                    } while (readByte == -1 && errno == EINTR);
                    if (readByte != -1) {
                        *data = uchar(readByte);
                        readBytes += 1;
                    } else {
                        break;
                    }
                }
            }
        }
        // Unix: Restore the blocking state of the underlying socket
        if ((oldFlags & O_NONBLOCK) == 0) {
            fcntl(QT_FILENO(fh), F_SETFL, oldFlags);
        }
        if (readBytes == 0 && !feof(fh)) {
            // if we didn't read anything and we're not at EOF, it must be an error
            q->setError(QFile::ReadError, qt_error_string(errno));
            return -1;
        }
        return readBytes;
    }

    return readFdFh(data, len);
}